

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2skin.cpp
# Opt level: O1

Stream * rw::ps2::writeNativeSkin(Stream *stream,int32 len,void *object,int32 offset)

{
  Skin *skin;
  int iVar1;
  uint32 buffer [4];
  undefined1 local_2c;
  undefined1 local_2b;
  undefined1 local_2a;
  undefined1 local_29;
  undefined8 local_28;
  undefined8 uStack_20;
  
  writeChunkHeader(stream,1,len + -0xc);
  Stream::writeU32(stream,4);
  iVar1 = version;
  skin = *(Skin **)((long)object + (long)offset);
  local_2c = (undefined1)skin->numBones;
  if (version < 0x34000) {
    local_2b = 0;
    local_2a = 0;
  }
  else {
    local_2b = (undefined1)skin->numUsedBones;
    local_2a = (undefined1)skin->numWeights;
  }
  local_29 = 0;
  (*stream->_vptr_Stream[3])(stream,&local_2c,4);
  if (iVar1 < 0x34000) {
    Stream::write32(stream,skin->inverseMatrices,skin->numBones << 6);
  }
  else {
    (*stream->_vptr_Stream[3])(stream,skin->usedBones,(ulong)(uint)skin->numUsedBones);
    Stream::write32(stream,skin->inverseMatrices,skin->numBones << 6);
    local_28 = 0;
    uStack_20 = 0;
    Stream::write32(stream,&local_28,0x10);
    writeSkinSplitData(stream,skin);
  }
  return stream;
}

Assistant:

Stream*
writeNativeSkin(Stream *stream, int32 len, void *object, int32 offset)
{
	uint8 header[4];

	writeChunkHeader(stream, ID_STRUCT, len-12);
	stream->writeU32(PLATFORM_PS2);
	Skin *skin = *PLUGINOFFSET(Skin*, object, offset);
	// not sure which version introduced the new format
	bool oldFormat = version < 0x34000;
	header[0] = skin->numBones;
	if(oldFormat){
		header[1] = 0;
		header[2] = 0;
	}else{
		header[1] = skin->numUsedBones;
		header[2] = skin->numWeights;
	}
	header[3] = 0;
	stream->write8(header, 4);

	if(!oldFormat)
		stream->write8(skin->usedBones, skin->numUsedBones);
	stream->write32(skin->inverseMatrices, skin->numBones*64);
	if(!oldFormat){
		uint32 buffer[4] = { 0, 0, 0, 0, };
		stream->write32(buffer, 4*4);

		writeSkinSplitData(stream, skin);
	}
	return stream;
}